

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::EndArray
          (Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,SizeType elementCount)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0x400000006cc;
  puVar1 = Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Pop<unsigned_long>
                     (&this->stack_,(ulong)elementCount);
  if (elementCount != 0) {
    uVar2 = 0;
    do {
      uVar3 = (uVar3 ^ puVar1[uVar2]) * 0x100000001b3;
      uVar2 = uVar2 + 1;
    } while (elementCount != uVar2);
  }
  puVar1 = Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Push<unsigned_long>
                     (&this->stack_,1);
  *puVar1 = uVar3;
  return true;
}

Assistant:

bool EndArray(SizeType elementCount) { 
        uint64_t h = Hash(0, kArrayType);
        uint64_t* e = stack_.template Pop<uint64_t>(elementCount);
        for (SizeType i = 0; i < elementCount; i++)
            h = Hash(h, e[i]); // Use hash to achieve element order sensitive
        *stack_.template Push<uint64_t>() = h;
        return true;
    }